

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O2

FieldMap * __thiscall FIX::FieldMap::getGroupRef(FieldMap *this,int num,int tag)

{
  int iVar1;
  const_iterator cVar2;
  FieldNotFound *pFVar3;
  allocator<char> local_45;
  int tag_local;
  string local_40;
  
  tag_local = tag;
  cVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
          ::find(&(this->m_groups)._M_t,&tag_local);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->m_groups)._M_t._M_impl.super__Rb_tree_header) {
    pFVar3 = (FieldNotFound *)__cxa_allocate_exception(0x58);
    iVar1 = tag_local;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_45);
    FieldNotFound::FieldNotFound(pFVar3,iVar1,&local_40);
    __cxa_throw(pFVar3,&FieldNotFound::typeinfo,Exception::~Exception);
  }
  if (0 < num) {
    if ((ulong)(uint)num <=
        (ulong)((long)cVar2._M_node[1]._M_left - (long)cVar2._M_node[1]._M_parent >> 3)) {
      return *(FieldMap **)((long)cVar2._M_node[1]._M_parent + (ulong)(uint)num * 8 + -8);
    }
    pFVar3 = (FieldNotFound *)__cxa_allocate_exception(0x58);
    iVar1 = tag_local;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_45);
    FieldNotFound::FieldNotFound(pFVar3,iVar1,&local_40);
    __cxa_throw(pFVar3,&FieldNotFound::typeinfo,Exception::~Exception);
  }
  pFVar3 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  iVar1 = tag_local;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_45);
  FieldNotFound::FieldNotFound(pFVar3,iVar1,&local_40);
  __cxa_throw(pFVar3,&FieldNotFound::typeinfo,Exception::~Exception);
}

Assistant:

FieldMap& getGroupRef( int num, int tag ) const
  EXCEPT ( FieldNotFound )
  {
    Groups::const_iterator i = m_groups.find( tag );
    if( i == m_groups.end() ) throw FieldNotFound( tag );
    if( num <= 0 ) throw FieldNotFound( tag );
    if( i->second.size() < (unsigned)num ) throw FieldNotFound( tag );
    return *( *(i->second.begin() + (num-1) ) );
  }